

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::PoolAllocator::fastFree(PoolAllocator *this,void *ptr)

{
  bool bVar1;
  pointer ppVar2;
  void *in_RSI;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *in_RDI
  ;
  size_t size;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff98;
  _List_node_base *this_00;
  const_iterator in_stack_ffffffffffffffa8;
  value_type *__x;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_30;
  unsigned_long local_28;
  _Self local_20;
  _Self local_18;
  void *local_10;
  
  local_10 = in_RSI;
  Mutex::lock((Mutex *)0x953e15);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      Mutex::unlock((Mutex *)0x953f4e);
      fprintf(_stderr,"FATAL ERROR! pool allocator get wild %p",local_10);
      fprintf(_stderr,"\n");
      ncnn::fastFree((void *)0x953f8d);
      return;
    }
    ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x953e65);
    if (ppVar2->second == local_10) break;
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_18);
  }
  ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x953e7e);
  local_28 = ppVar2->first;
  this_00 = (in_RDI->
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            )._M_impl._M_node.super__List_node_base._M_prev + 7;
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_30,&local_18);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            ((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              *)this_00,in_stack_ffffffffffffffa8);
  Mutex::unlock((Mutex *)0x953ed3);
  Mutex::lock((Mutex *)0x953ee1);
  __x = (value_type *)
        &(in_RDI->
         super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         )._M_impl._M_node.super__List_node_base._M_prev[5]._M_prev;
  std::make_pair<unsigned_long&,void*&>((unsigned_long *)this_00,(void **)in_stack_ffffffffffffff98)
  ;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(in_RDI,__x);
  Mutex::unlock((Mutex *)0x953f29);
  return;
}

Assistant:

void PoolAllocator::fastFree(void* ptr)
{
    d->payouts_lock.lock();

    // return to budgets
    std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
    for (; it != d->payouts.end(); ++it)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            d->payouts.erase(it);

            d->payouts_lock.unlock();

            d->budgets_lock.lock();

            d->budgets.push_back(std::make_pair(size, ptr));

            d->budgets_lock.unlock();

            return;
        }
    }

    d->payouts_lock.unlock();

    NCNN_LOGE("FATAL ERROR! pool allocator get wild %p", ptr);
    ncnn::fastFree(ptr);
}